

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O1

void __thiscall
Refal2::COperationsExecuter::macthLeftMaxByQualifierSaveToTable_E
          (COperationsExecuter *this,TQualifierIndex qualifier)

{
  int iVar1;
  CUnitNode *pCVar2;
  anon_union_8_5_86ac0f1f_for_CUnit_1 aVar3;
  bool bVar4;
  int iVar5;
  CUnitNode *pCVar6;
  CNode<Refal2::CUnit> *pCVar7;
  CUnit local_38;
  
  pCVar2 = this->left;
  pCVar6 = pCVar2;
  while( true ) {
    if ((pCVar6 == (CUnitNode *)0x0) || (this->right == (CNode<Refal2::CUnit> *)0x0)) {
      __assert_fail("left != nullptr && right != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/OperationsExecuter.h"
                    ,0xfd,"bool Refal2::COperationsExecuter::isEmpty() const");
    }
    pCVar7 = pCVar6->next;
    if (pCVar7 == this->right) break;
    if (((pCVar7->super_CUnit).type & UT_Label) == 0) {
LAB_00126e9a:
      bVar4 = CQualifier::Check(qualifier,&pCVar7->super_CUnit);
    }
    else {
      iVar1 = (pCVar7->super_CUnit).field_1.label;
      iVar5 = iVar1 + 0xffff;
      if (-1 < iVar1) {
        iVar5 = iVar1;
      }
      if (iVar5 >> 0x10 == (this->super_CExecutionContext).RuntimeModuleId) {
        local_38.type = (pCVar7->super_CUnit).type;
        local_38._4_4_ = *(undefined4 *)&(pCVar7->super_CUnit).field_0x4;
        aVar3 = (pCVar7->super_CUnit).field_1;
        local_38.field_1.label = aVar3.label;
        local_38.field_1._4_4_ = aVar3._4_4_;
        local_38.field_1.label = local_38.field_1.label % 0x10000;
        pCVar7 = (CNode<Refal2::CUnit> *)&local_38;
        goto LAB_00126e9a;
      }
      bVar4 = (bool)(((byte)qualifier->flags & 4) >> 2);
    }
    if (bVar4 == false) break;
    pCVar7 = this->left->next;
    this->left = pCVar7;
    if (((pCVar7->super_CUnit).type & UT_LeftParen) != 0) {
      this->left = (CUnitNode *)(pCVar7->super_CUnit).field_1;
    }
    pCVar6 = this->left;
  }
  pCVar6 = this->left;
  iVar1 = this->tableTop;
  iVar5 = (((this->super_CExecutionContext).Program.
            super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_CCompilationContext).maxTableSize;
  if (pCVar6 == pCVar2) {
    if (iVar1 < iVar5) {
      this->table[iVar1] = (CUnitNode *)0x0;
      this->tableTop = iVar1 + 1;
      if (iVar1 + 1 <
          (((this->super_CExecutionContext).Program.
            super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_CCompilationContext).maxTableSize) {
        pCVar6 = (CUnitNode *)0x0;
        goto LAB_00126f49;
      }
    }
  }
  else if (iVar1 < iVar5) {
    this->table[iVar1] = pCVar2->next;
    this->tableTop = iVar1 + 1;
    if (iVar1 + 1 <
        (((this->super_CExecutionContext).Program.
          super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_CCompilationContext).maxTableSize) {
LAB_00126f49:
      this->table[iVar1 + 1] = pCVar6;
      this->tableTop = iVar1 + 2;
      return;
    }
  }
  __assert_fail("tableTop < Program->MaxTableSize()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/OperationsExecuter.h"
                ,0xef,"void Refal2::COperationsExecuter::saveToTable(CUnitNode *const)");
}

Assistant:

inline void COperationsExecuter::macthLeftMaxByQualifierSaveToTable_E(
	const TQualifierIndex qualifier )
{
	CUnitNode* first = left;
	while( !isEmpty() && checkQualifier( left->Next(), qualifier ) ) {
		left = left->Next();
		if( left->IsLeftParen() ) {
			left = left->PairedParen();
		}
	}
	if( left == first ) {
		saveToTable( 0, 0 );
	} else {
		saveToTable( first->Next(), left );
	}
}